

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall
Assimp::ASE::Parser::ParseLV3MeshFaceListBlock(Parser *this,uint iNumFaces,Mesh *mesh)

{
  bool bVar1;
  reference __dest;
  undefined1 local_a8 [8];
  Face mFace;
  int iDepth;
  Mesh *mesh_local;
  uint iNumFaces_local;
  Parser *this_local;
  
  mFace.iMaterial = 0;
  unique0x100001c4 = mesh;
  std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::resize
            (&(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces,(ulong)iNumFaces);
  do {
    while (*this->filePtr != '*') {
LAB_005cd2d5:
      if (*this->filePtr == '{') {
        mFace.iMaterial = mFace.iMaterial + 1;
      }
      else if (*this->filePtr == '}') {
        mFace.iMaterial = mFace.iMaterial - 1;
        if (mFace.iMaterial == 0) {
          this->filePtr = this->filePtr + 1;
          SkipToNextToken(this);
          return;
        }
      }
      else if (*this->filePtr == '\0') {
        LogError(this,"Encountered unexpected EOL while parsing a *MESH_FACE_LIST chunk (Level 3)");
      }
      bVar1 = IsLineEnd<char>(*this->filePtr);
      if ((bVar1) && ((this->bLastWasEndLine & 1U) == 0)) {
        this->iLineNumber = this->iLineNumber + 1;
        this->bLastWasEndLine = true;
      }
      else {
        this->bLastWasEndLine = false;
      }
      this->filePtr = this->filePtr + 1;
    }
    this->filePtr = this->filePtr + 1;
    bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_FACE",9);
    if (!bVar1) goto LAB_005cd2d5;
    ASE::Face::Face((Face *)local_a8);
    ParseLV4MeshFace(this,(Face *)local_a8);
    if (mFace.mColorIndices[2] < iNumFaces) {
      __dest = std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::operator[]
                         (&(stack0xffffffffffffffe0->
                           super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces,
                          (ulong)mFace.mColorIndices[2]);
      memcpy(__dest,local_a8,0x84);
    }
    else {
      LogWarning(this,"Face has an invalid index. It will be ignored");
    }
  } while( true );
}

Assistant:

void Parser::ParseLV3MeshFaceListBlock(unsigned int iNumFaces, ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();

    // allocate enough storage in the face array
    mesh.mFaces.resize(iNumFaces);
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Face entry
            if (TokenMatch(filePtr,"MESH_FACE" ,9))
            {

                ASE::Face mFace;
                ParseLV4MeshFace(mFace);

                if (mFace.iFace >= iNumFaces)
                {
                    LogWarning("Face has an invalid index. It will be ignored");
                }
                else mesh.mFaces[mFace.iFace] = mFace;
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_FACE_LIST");
    }
    return;
}